

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall TestRunMultiple::Run(TestRunMultiple *this)

{
  pointer outputter;
  byte local_1729;
  RunParams local_1708;
  undefined1 local_16f0 [8];
  Results rs;
  string local_16d0 [32];
  undefined1 local_16b0 [8];
  TestRunMultipleInternal test1;
  string local_1660 [32];
  undefined1 local_1640 [8];
  TestRunMultipleInternal test0;
  unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_> local_15f0;
  unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_> op;
  ostringstream local_15d8 [8];
  ostringstream oss;
  undefined1 local_1460 [8];
  TestRegistry r;
  TestRunMultiple *this_local;
  
  r._5192_8_ = this;
  testinator::TestRegistry::TestRegistry((TestRegistry *)local_1460);
  std::__cxx11::ostringstream::ostringstream(local_15d8);
  std::make_unique<testinator::DefaultOutputter,std::__cxx11::ostringstream&>
            ((basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &test0.m_runCalled);
  std::unique_ptr<testinator::Outputter,std::default_delete<testinator::Outputter>>::
  unique_ptr<testinator::DefaultOutputter,std::default_delete<testinator::DefaultOutputter>,void>
            ((unique_ptr<testinator::Outputter,std::default_delete<testinator::Outputter>> *)
             &local_15f0,
             (unique_ptr<testinator::DefaultOutputter,_std::default_delete<testinator::DefaultOutputter>_>
              *)&test0.m_runCalled);
  std::unique_ptr<testinator::DefaultOutputter,_std::default_delete<testinator::DefaultOutputter>_>
  ::~unique_ptr((unique_ptr<testinator::DefaultOutputter,_std::default_delete<testinator::DefaultOutputter>_>
                 *)&test0.m_runCalled);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1660,"test0",(allocator *)&test1.field_0x47);
  TestRunMultipleInternal::TestRunMultipleInternal
            ((TestRunMultipleInternal *)local_1640,(TestRegistry *)local_1460,(string *)local_1660);
  std::__cxx11::string::~string(local_1660);
  std::allocator<char>::~allocator((allocator<char> *)&test1.field_0x47);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_16d0,"test1",
             (allocator *)
             ((long)&rs.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  TestRunMultipleInternal::TestRunMultipleInternal
            ((TestRunMultipleInternal *)local_16b0,(TestRegistry *)local_1460,(string *)local_16d0);
  std::__cxx11::string::~string(local_16d0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&rs.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_1708.m_flags = 0;
  local_1708._4_4_ = 0;
  local_1708.m_numPropertyChecks = 0;
  local_1708.m_randomSeed = 0;
  testinator::RunParams::RunParams(&local_1708);
  outputter = std::unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_>::
              get(&local_15f0);
  testinator::TestRegistry::RunAllTests
            ((Results *)local_16f0,(TestRegistry *)local_1460,&local_1708,outputter);
  local_1729 = 0;
  if (((byte)test0.super_Test.m_op & 1) != 0) {
    local_1729 = (byte)test1.super_Test.m_op;
  }
  std::vector<testinator::Result,_std::allocator<testinator::Result>_>::~vector
            ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)local_16f0);
  TestRunMultipleInternal::~TestRunMultipleInternal((TestRunMultipleInternal *)local_16b0);
  TestRunMultipleInternal::~TestRunMultipleInternal((TestRunMultipleInternal *)local_1640);
  std::unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_>::~unique_ptr
            (&local_15f0);
  std::__cxx11::ostringstream::~ostringstream(local_15d8);
  testinator::TestRegistry::~TestRegistry((TestRegistry *)local_1460);
  return (bool)(local_1729 & 1);
}

Assistant:

virtual bool Run()
  {
    testinator::TestRegistry r;
    ostringstream oss;
    std::unique_ptr<testinator::Outputter> op =
      make_unique<testinator::DefaultOutputter>(oss);

    TestRunMultipleInternal test0(r, "test0");
    TestRunMultipleInternal test1(r, "test1");
    testinator::Results rs = r.RunAllTests(testinator::RunParams(), op.get());
    return test0.m_runCalled && test1.m_runCalled;
  }